

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O2

void b64From(char *dest,void *src,size_t count)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  
  pcVar5 = dest + 4;
  for (; 2 < count; count = count - 3) {
    bVar1 = *src;
    bVar2 = *(byte *)((long)src + 1);
    bVar3 = *(byte *)((long)src + 2);
    pcVar5[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f];
    pcVar5[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(ushort)(CONCAT11(bVar2,bVar3) >> 6) & 0x3f];
    pcVar5[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [((uint)bVar1 << 0x10 | (uint)bVar2 << 8) >> 0xc & 0x3f];
    pcVar5[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
    src = (void *)((long)src + 3);
    pcVar5 = pcVar5 + 4;
  }
  if (count == 1) {
    bVar1 = *src;
    pcVar5[-2] = '=';
    pcVar5[-1] = '=';
    uVar4 = (bVar1 & 3) << 4;
  }
  else {
    if (count != 2) {
      pcVar5 = pcVar5 + -4;
      goto LAB_001107d2;
    }
    bVar1 = *src;
    bVar2 = *(byte *)((long)src + 1);
    pcVar5[-1] = '=';
    pcVar5[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(bVar2 & 0xf) << 2];
    uVar4 = (uint)bVar1 * 0x400 + (uint)bVar2 * 4 >> 6 & 0x3f;
  }
  pcVar5[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar4];
  pcVar5[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
LAB_001107d2:
  *pcVar5 = '\0';
  return;
}

Assistant:

void b64From(char* dest, const void* src, size_t count)
{
	register u32 block;
	ASSERT(memIsDisjoint2(src, count, dest, 4 * ((count + 2) / 3) + 1));
	for (; count >= 3; count -= 3)
	{
		block  = ((const octet*)src)[0], block <<= 8;
		block |= ((const octet*)src)[1], block <<= 8;
		block |= ((const octet*)src)[2];
		dest[3] = b64_alphabet[block & 63], block >>= 6;
		dest[2] = b64_alphabet[block & 63], block >>= 6;
		dest[1] = b64_alphabet[block & 63], block >>= 6;
		dest[0] = b64_alphabet[block];
		src = (const octet*)src + 3;
		dest += 4;
	}
	if (count == 2)
	{
		block  = ((const octet*)src)[0], block <<= 8;
		block |= ((const octet*)src)[1], block <<= 2;
		dest[3] = '=';
		dest[2] = b64_alphabet[block & 63], block >>= 6;
		dest[1] = b64_alphabet[block & 63], block >>= 6;
		dest[0] = b64_alphabet[block];
		dest += 4;
	}
	else if (count == 1)
	{
		block  = ((const octet*)src)[0], block <<= 4;
		dest[3] = dest[2] = '=';
		dest[1] = b64_alphabet[block & 63], block >>= 6;
		dest[0] = b64_alphabet[block];
		dest += 4;
	}
	*dest = '\0';
	block = 0;
}